

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O0

EdwardsPoint * ecc_edwards_point_new_from_y(EdwardsCurve *ec,mp_int *yorig,uint desired_x_parity)

{
  MontyContext *mc;
  uint uVar1;
  mp_int *x_00;
  mp_int *pmVar2;
  mp_int *x_01;
  mp_int *x_02;
  mp_int *pmVar3;
  mp_int *y_00;
  mp_int *x_03;
  mp_int *x_04;
  uint flip;
  mp_int *tmp;
  mp_int *x;
  mp_int *radicand;
  mp_int *recip_denominator;
  mp_int *y2m1;
  mp_int *dy2ma;
  mp_int *dy2;
  mp_int *y2;
  mp_int *y;
  uint success;
  uint desired_x_parity_local;
  mp_int *yorig_local;
  EdwardsCurve *ec_local;
  
  y._4_4_ = desired_x_parity;
  _success = yorig;
  yorig_local = (mp_int *)ec;
  if (ec->sc != (ModsqrtContext *)0x0) {
    x_00 = monty_import(ec->mc,yorig);
    pmVar2 = monty_mul((MontyContext *)yorig_local->w,x_00,x_00);
    x_01 = monty_mul((MontyContext *)yorig_local->w,(mp_int *)yorig_local[1].w,pmVar2);
    x_02 = monty_sub((MontyContext *)yorig_local->w,x_01,(mp_int *)yorig_local[2].nw);
    mc = (MontyContext *)yorig_local->w;
    pmVar3 = monty_identity((MontyContext *)yorig_local->w);
    pmVar3 = monty_sub(mc,pmVar2,pmVar3);
    y_00 = monty_invert((MontyContext *)yorig_local->w,x_02);
    x_03 = monty_mul((MontyContext *)yorig_local->w,pmVar3,y_00);
    x_04 = monty_modsqrt((ModsqrtContext *)yorig_local[1].nw,x_03,(uint *)&y);
    mp_free(pmVar2);
    mp_free(x_01);
    mp_free(x_02);
    mp_free(pmVar3);
    mp_free(y_00);
    mp_free(x_03);
    if ((int)y == 0) {
      mp_free(x_04);
      mp_free(x_00);
      ec_local = (EdwardsCurve *)0x0;
    }
    else {
      pmVar2 = monty_export((MontyContext *)yorig_local->w,x_04);
      uVar1 = mp_get_bit(pmVar2,0);
      uVar1 = uVar1 ^ y._4_4_;
      mp_sub_into(pmVar2,(mp_int *)yorig_local->nw,x_04);
      mp_select_into(x_04,x_04,pmVar2,uVar1 & 1);
      mp_free(pmVar2);
      ec_local = (EdwardsCurve *)
                 ecc_edwards_point_new_imported((EdwardsCurve *)yorig_local,x_04,x_00);
    }
    return (EdwardsPoint *)ec_local;
  }
  __assert_fail("ec->sc",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-arithmetic.c"
                ,0x3c2,
                "EdwardsPoint *ecc_edwards_point_new_from_y(EdwardsCurve *, mp_int *, unsigned int)"
               );
}

Assistant:

EdwardsPoint *ecc_edwards_point_new_from_y(
    EdwardsCurve *ec, mp_int *yorig, unsigned desired_x_parity)
{
    assert(ec->sc);

    /*
     * The curve equation is ax^2 + y^2 = 1 + dx^2y^2, which
     * rearranges to x^2(dy^2-a) = y^2-1. So we compute
     * (y^2-1)/(dy^2-a) and take its square root.
     */
    unsigned success;

    mp_int *y = monty_import(ec->mc, yorig);
    mp_int *y2 = monty_mul(ec->mc, y, y);
    mp_int *dy2 = monty_mul(ec->mc, ec->d, y2);
    mp_int *dy2ma = monty_sub(ec->mc, dy2, ec->a);
    mp_int *y2m1 = monty_sub(ec->mc, y2, monty_identity(ec->mc));
    mp_int *recip_denominator = monty_invert(ec->mc, dy2ma);
    mp_int *radicand = monty_mul(ec->mc, y2m1, recip_denominator);
    mp_int *x = monty_modsqrt(ec->sc, radicand, &success);
    mp_free(y2);
    mp_free(dy2);
    mp_free(dy2ma);
    mp_free(y2m1);
    mp_free(recip_denominator);
    mp_free(radicand);

    if (!success) {
        /* Failure! x^2 worked out to be a number that has no square
         * root mod p. In this situation there's no point in trying to
         * be time-constant, since the protocol sequence is going to
         * diverge anyway when we complain to whoever gave us this
         * bogus value. */
        mp_free(x);
        mp_free(y);
        return NULL;
    }

    /*
     * Choose whichever of x and p-x has the specified parity (of its
     * lowest positive residue mod p).
     */
    mp_int *tmp = monty_export(ec->mc, x);
    unsigned flip = (mp_get_bit(tmp, 0) ^ desired_x_parity) & 1;
    mp_sub_into(tmp, ec->p, x);
    mp_select_into(x, x, tmp, flip);
    mp_free(tmp);

    return ecc_edwards_point_new_imported(ec, x, y);
}